

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O2

int coda_type_get_bit_size(coda_type *type,int64_t *bit_size)

{
  long lVar1;
  undefined8 uVar2;
  char *message;
  
  if (type == (coda_type *)0x0) {
    message = "type argument is NULL (%s:%u)";
    uVar2 = 0xb95;
  }
  else {
    if (bit_size != (int64_t *)0x0) {
      lVar1 = -1;
      if (-1 < type->bit_size) {
        lVar1 = type->bit_size;
      }
      *bit_size = lVar1;
      return 0;
    }
    message = "bit_size argument is NULL (%s:%u)";
    uVar2 = 0xb9a;
  }
  coda_set_error(-100,message,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                 ,uVar2);
  return -1;
}

Assistant:

LIBCODA_API int coda_type_get_bit_size(const coda_type *type, int64_t *bit_size)
{
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (bit_size == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "bit_size argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    *bit_size = (type->bit_size >= 0 ? type->bit_size : -1);
    return 0;
}